

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O0

void __thiscall create::Serial::notifyDataReady(Serial *this)

{
  bool bVar1;
  element_type *this_00;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Serial *this_local;
  
  lock._M_device = (mutex_type *)this;
  this_00 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->data);
  Data::validateAll(this_00);
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->dataReadyMut);
  if ((this->dataReady & 1U) == 0) {
    this->dataReady = true;
    std::condition_variable::notify_one();
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->callback);
  if (bVar1) {
    std::function<void_()>::operator()(&this->callback);
  }
  return;
}

Assistant:

void Serial::notifyDataReady() {
    // Validate all packets
    data->validateAll();

    // Notify first data packets ready
    {
      std::lock_guard<std::mutex> lock(dataReadyMut);
      if (!dataReady) {
        dataReady = true;
        dataReadyCond.notify_one();
      }
    }
    // Callback to notify data is ready
    if (callback)
      callback();
  }